

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Delaunay_psm.cpp
# Opt level: O1

bool __thiscall GEO::Logger::is_client(Logger *this,LoggerClient *c)

{
  int *piVar1;
  _Base_ptr p_Var2;
  _Rb_tree_header *p_Var3;
  _Base_ptr p_Var4;
  
  if (c != (LoggerClient *)0x0) {
    piVar1 = &(c->super_Counted).nb_refs_;
    *piVar1 = *piVar1 + 1;
  }
  p_Var3 = &(this->clients_)._M_t._M_impl.super__Rb_tree_header;
  p_Var4 = (this->clients_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var2 = &p_Var3->_M_header;
  for (; p_Var4 != (_Base_ptr)0x0; p_Var4 = (&p_Var4->_M_left)[*(LoggerClient **)(p_Var4 + 1) < c])
  {
    if (*(LoggerClient **)(p_Var4 + 1) >= c) {
      p_Var2 = p_Var4;
    }
  }
  p_Var4 = &p_Var3->_M_header;
  if (((_Rb_tree_header *)p_Var2 != p_Var3) && (p_Var4 = p_Var2, c < *(LoggerClient **)(p_Var2 + 1))
     ) {
    p_Var4 = &p_Var3->_M_header;
  }
  if (c != (LoggerClient *)0x0) {
    piVar1 = &(c->super_Counted).nb_refs_;
    *piVar1 = *piVar1 + -1;
    if (*piVar1 == 0) {
      (*(c->super_Counted)._vptr_Counted[1])(c);
    }
  }
  return (_Rb_tree_header *)p_Var4 != p_Var3;
}

Assistant:

bool Logger::is_client(LoggerClient* c) const {
        return clients_.find(c) != clients_.end();
    }